

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree.h
# Opt level: O1

void __thiscall
phmap::priv::
btree_node<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_false>_>::
remove_value(btree_node<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_false>_>
             *this,int i,allocator_type *alloc)

{
  ulong i_00;
  btree_node<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_false>_>
  *pbVar1;
  long lVar2;
  size_type i_01;
  ulong i_02;
  
  if (((ulong)this & 7) == 0) {
    if ((this[0xb] ==
         (btree_node<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_false>_>
          )0x0) && (i + 1 < (int)(uint)(byte)this[10])) {
      i_02 = (ulong)(i + 1);
      pbVar1 = child(this,i_02);
      if (((ulong)pbVar1 & 7) != 0) goto LAB_001e9654;
      if (pbVar1[10] !=
          (btree_node<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_false>_>
           )0x0) {
        __assert_fail("child(i + 1)->count() == 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/btree.h"
                      ,0x869,
                      "void phmap::priv::btree_node<phmap::priv::set_params<int, phmap::Less<int>, std::allocator<int>, 256, false>>::remove_value(const int, allocator_type *) [Params = phmap::priv::set_params<int, phmap::Less<int>, std::allocator<int>, 256, false>]"
                     );
      }
      i_01 = (size_type)(byte)this[10];
      if (i_02 < i_01) {
        do {
          i_00 = i_02 + 1;
          pbVar1 = child(this,i_00);
          set_child(this,i_02,pbVar1);
          i_01 = (size_type)(byte)this[10];
          i_02 = i_00;
        } while (i_00 < i_01);
      }
      mutable_child(this,i_01);
    }
    lVar2 = (long)i;
    if (this + lVar2 * 4 + 0x10 != this + (ulong)(byte)this[10] * 4 + 0xc) {
      memmove(this + lVar2 * 4 + 0xc,this + lVar2 * 4 + 0x10,
              ((ulong)(byte)this[10] * 4 + lVar2 * -4) - 4);
    }
    this[10] = (btree_node<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_false>_>
                )((char)this[10] + -1);
    return;
  }
LAB_001e9654:
  __assert_fail("reinterpret_cast<uintptr_t>(p) % alignment == 0",
                "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/phmap_base.h"
                ,0xf84,
                "CopyConst<Char, ElementType<N>> *phmap::priv::internal_layout::LayoutImpl<std::tuple<phmap::priv::btree_node<phmap::priv::set_params<int, phmap::Less<int>, std::allocator<int>, 256, false>> *, unsigned char, int, phmap::priv::btree_node<phmap::priv::set_params<int, phmap::Less<int>, std::allocator<int>, 256, false>> *>, phmap::integer_sequence<unsigned long, 0, 1, 2, 3>, phmap::integer_sequence<unsigned long, 0, 1, 2, 3>>::Pointer(Char *) const [Elements = std::tuple<phmap::priv::btree_node<phmap::priv::set_params<int, phmap::Less<int>, std::allocator<int>, 256, false>> *, unsigned char, int, phmap::priv::btree_node<phmap::priv::set_params<int, phmap::Less<int>, std::allocator<int>, 256, false>> *>, SizeSeq = phmap::integer_sequence<unsigned long, 0, 1, 2, 3>, OffsetSeq = phmap::integer_sequence<unsigned long, 0, 1, 2, 3>, N = 1UL, Char = const char]"
               );
}

Assistant:

inline void btree_node<P>::remove_value(const int i, allocator_type *alloc) {
        if (!leaf() && count() > i + 1) {
            assert(child(i + 1)->count() == 0);
            for (size_type j = i + 1; j < count(); ++j) {
                set_child(j, child(j + 1));
            }
            clear_child(count());
        }

        remove_values_ignore_children(i, /*to_erase=*/1, alloc);
    }